

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  MemoryManager *m;
  size_t *last_insert_len;
  size_t *num_literals;
  uint8_t prev_byte;
  byte prev_byte2;
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *data;
  HasherHandle puVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  size_t num_commands;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  uint uVar13;
  int iVar14;
  ContextType literal_context_mode;
  uint32_t *puVar15;
  uint8_t *puVar16;
  int *piVar17;
  ulong uVar18;
  Command *pCVar19;
  ulong uVar20;
  byte bVar21;
  char cVar22;
  uint uVar23;
  long lVar24;
  uint16_t uVar25;
  int iVar26;
  size_t __n;
  ulong uVar27;
  ulong mask;
  ulong uVar28;
  ulong uVar29;
  BrotliEncoderState *pBVar30;
  uint32_t uVar31;
  int *piVar32;
  ulong uVar33;
  size_t *psVar34;
  ushort uVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  HasherCommon *common;
  uint8_t **ppuVar43;
  BrotliHasherParams *pBVar44;
  uint uVar45;
  size_t sVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  byte bVar51;
  ulong local_250;
  ulong local_240;
  ulong local_228;
  size_t storage_ix_1;
  ulong local_210;
  size_t *local_208;
  int *local_200;
  ulong local_1f8;
  int *local_1f0;
  size_t local_1e8;
  uint8_t **local_1e0;
  ulong local_1d8;
  size_t *local_1d0;
  uint8_t *local_1c8;
  ulong local_1c0;
  uint32_t *local_1b8;
  size_t num_literal_contexts;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  size_t storage_ix;
  BlockSplit local_160;
  BlockSplit local_130;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  size_t table_size;
  uint local_70;
  
  bVar51 = 0;
  local_1f0 = (int *)s->last_processed_pos_;
  uVar23 = (uint)local_1f0;
  if (2 < (ulong)local_1f0 >> 0x1e) {
    uVar23 = ((int)(uVar23 * 2) >> 1 & 0xc0000000U) + (uVar23 & 0x3fffffff) + 0x80000000;
  }
  local_250 = (ulong)uVar23;
  uVar27 = s->input_pos_;
  EnsureInitialized(s);
  piVar17 = local_1f0;
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  local_1e8 = CONCAT44(local_1e8._4_4_,force_flush);
  local_240 = uVar27 - (long)local_1f0;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  uVar2 = (s->ringbuffer_).mask_;
  mask = (ulong)uVar2;
  data = (s->ringbuffer_).buffer_;
  EnsureInitialized(s);
  if ((ulong)(1L << ((byte)(s->params).lgblock & 0x3f)) < local_240) {
    return 0;
  }
  m = &s->memory_manager_;
  uVar13 = (s->params).quality;
  uVar36 = (uint)local_240;
  local_1e0 = output;
  if (uVar13 == 1) {
    if (s->command_buf_ != (uint32_t *)0x0) goto LAB_00127b63;
    puVar15 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar15;
    puVar16 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar16;
    uVar13 = (s->params).quality;
  }
  if (uVar13 < 2) {
LAB_00127b63:
    storage_ix = (size_t)s->last_bytes_bits_;
    if (is_last == 0 && (int *)uVar27 == piVar17) {
      sVar46 = 0;
    }
    else {
      puVar16 = GetBrotliStorage(s,(ulong)(uVar36 * 2 + 0x1f7));
      *puVar16 = (uint8_t)s->last_bytes_;
      puVar16[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      local_240 = local_240 & 0xffffffff;
      piVar17 = GetHashTable(s,(s->params).quality,local_240,&table_size);
      ppuVar43 = local_1e0;
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,data + (uVar2 & uVar23),local_240,is_last,piVar17,table_size,s->cmd_depths_,
                   s->cmd_bits_,&s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar16);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,data + (uVar2 & uVar23),local_240,is_last,s->command_buf_,s->literal_buf_,
                   piVar17,table_size,&storage_ix,puVar16);
        ppuVar43 = output;
      }
      sVar46 = storage_ix >> 3;
      s->last_bytes_ = (ushort)puVar16[sVar46];
      s->last_bytes_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *ppuVar43 = puVar16;
    }
    *out_size = sVar46;
    return 1;
  }
  uVar18 = s->num_commands_ + (local_240 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar18) {
    sVar46 = (local_240 >> 2 & 0x3fffffff) + uVar18 + 0x10;
    s->cmd_alloc_size_ = sVar46;
    if (sVar46 == 0) {
      pCVar19 = (Command *)0x0;
    }
    else {
      pCVar19 = (Command *)BrotliAllocate(m,sVar46 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar19,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
    }
    s->commands_ = pCVar19;
  }
  bVar49 = is_last != 0;
  uVar18 = local_240 & 0xffffffff;
  bVar50 = uVar23 == 0;
  piVar17 = (int *)s->hasher_;
  local_1d0 = out_size;
  if (piVar17 == (int *)0x0) {
    pBVar44 = &(s->params).hasher;
    uVar13 = (s->params).quality;
    if ((int)uVar13 < 10) {
      if (uVar13 == 4) {
        if ((s->params).size_hint < 0x100000) goto LAB_00127ec3;
        pBVar44->type = 0x36;
        sVar46 = 0x400038;
      }
      else {
        if ((int)uVar13 < 5) {
LAB_00127ec3:
          pBVar44->type = uVar13;
          uVar42 = uVar13;
        }
        else {
          uVar42 = (s->params).lgwin;
          if ((int)uVar42 < 0x11) {
            bVar47 = uVar13 < 9;
            bVar48 = 6 < uVar13;
            uVar13 = 0x28;
            if (bVar48) {
              uVar13 = 0x2a - bVar47;
            }
            goto LAB_00127ec3;
          }
          if ((uVar42 < 0x13) || ((s->params).size_hint < 0x100000)) {
            uVar39 = uVar13 < 7 ^ 0xf;
            uVar42 = 5;
          }
          else {
            (s->params).hasher.hash_len = 5;
            uVar39 = 0xf;
            uVar42 = 6;
          }
          iVar14 = 0x10;
          if (uVar13 < 9) {
            iVar14 = 10;
          }
          iVar26 = 4;
          if (6 < uVar13) {
            iVar26 = iVar14;
          }
          (s->params).hasher.type = uVar42;
          (s->params).hasher.block_bits = uVar13 - 1;
          (s->params).hasher.bucket_bits = uVar39;
          (s->params).hasher.num_last_distances_to_check = iVar26;
        }
        sVar46 = 0x28;
        if ((int)uVar42 < 0x28) {
          switch(uVar42) {
          case 2:
            sVar46 = 0x4002c;
            break;
          case 3:
            sVar46 = 0x40030;
            break;
          case 4:
switchD_00127eeb_caseD_4:
            sVar46 = 0x80038;
            break;
          case 5:
            sVar46 = ((4L << ((byte)(s->params).hasher.block_bits & 0x3f) | 2U) <<
                     ((byte)(s->params).hasher.bucket_bits & 0x3f)) + 0x40;
            break;
          case 6:
            sVar46 = ((4L << ((byte)(s->params).hasher.block_bits & 0x3f) | 2U) <<
                     ((byte)(s->params).hasher.bucket_bits & 0x3f)) + 0x50;
          }
        }
        else {
          if ((uVar42 == 0x28) || (uVar42 == 0x29)) goto switchD_00127eeb_caseD_4;
          if (uVar42 == 0x2a) {
            sVar46 = 0x140430;
          }
        }
      }
    }
    else {
      (s->params).hasher.type = 10;
      uVar20 = 1L << ((byte)(s->params).lgwin & 0x3f);
      uVar29 = uVar18;
      if (uVar20 < uVar18) {
        uVar29 = uVar20;
      }
      if (!bVar50 || !bVar49) {
        uVar29 = uVar20;
      }
      sVar46 = uVar29 * 8 + 0x80038;
    }
    piVar17 = (int *)BrotliAllocate(m,sVar46);
    s->hasher_ = (HasherHandle)piVar17;
    iVar14 = pBVar44->bucket_bits;
    iVar26 = (s->params).hasher.block_bits;
    iVar12 = (s->params).hasher.hash_len;
    piVar17[0] = pBVar44->type;
    piVar17[1] = iVar14;
    piVar17[2] = iVar26;
    piVar17[3] = iVar12;
    piVar17[4] = (s->params).hasher.num_last_distances_to_check;
    iVar14 = *piVar17;
    piVar17 = (int *)s->hasher_;
    if (iVar14 < 0x28) {
      if (iVar14 == 5) {
        piVar17[0xe] = 0x20 - piVar17[1];
        *(long *)(piVar17 + 10) = 1L << ((byte)piVar17[1] & 0x3f);
        lVar24 = 1L << (*(byte *)(piVar17 + 2) & 0x3f);
        *(long *)(piVar17 + 0xc) = lVar24;
        piVar17[0xf] = (int)lVar24 + -1;
      }
      else if (iVar14 == 6) {
        piVar17[0xe] = 0x40 - piVar17[1];
        *(ulong *)(piVar17 + 0x10) = 0xffffffffffffffff >> ((char)piVar17[3] * -8 & 0x3fU);
        *(long *)(piVar17 + 10) = 1L << ((byte)piVar17[1] & 0x3f);
        lVar24 = 1L << (*(byte *)(piVar17 + 2) & 0x3f);
        *(long *)(piVar17 + 0xc) = lVar24;
        piVar17[0x12] = (int)lVar24 + -1;
      }
      else if (iVar14 == 10) {
        uVar13 = -1 << ((byte)(s->params).lgwin & 0x1f);
        *(ulong *)(piVar17 + 10) = (ulong)~uVar13;
        piVar17[0x2000c] = uVar13 + 1;
      }
      else {
LAB_00127f79:
        if (piVar17 == (int *)0x0) {
          piVar17 = (int *)0x0;
          goto LAB_00128003;
        }
      }
    }
    else if (iVar14 == 0x28) {
      iVar14 = (s->params).quality;
      *(ulong *)(piVar17 + 0x2000c) = (ulong)((iVar14 < 7) + 7 << ((char)iVar14 - 4U & 0x1f));
    }
    else if (iVar14 == 0x29) {
      iVar14 = (s->params).quality;
      *(ulong *)(piVar17 + 0x2000c) = (ulong)((iVar14 < 7) + 7 << ((char)iVar14 - 4U & 0x1f));
    }
    else {
      if (iVar14 != 0x2a) goto LAB_00127f79;
      iVar14 = (s->params).quality;
      *(ulong *)(piVar17 + 0x5010a) = (ulong)((iVar14 < 7) + 7 << ((char)iVar14 - 4U & 0x1f));
    }
    piVar17[5] = 0;
  }
LAB_00128003:
  uVar29 = (ulong)uVar23;
  if (piVar17[5] == 0) {
    iVar14 = *piVar17;
    if (0x27 < iVar14) {
      if (iVar14 < 0x2a) {
        if (iVar14 == 0x28) {
          if ((uVar36 < 0x201) && (bVar50 && bVar49)) {
            if (uVar18 != 0) {
              uVar20 = 0;
              do {
                uVar33 = (ulong)((uint)(*(int *)(data + uVar20) * 0x1e35a7bd) >> 0x11);
                piVar17[uVar33 + 10] = -0x33333334;
                *(undefined2 *)((long)piVar17 + uVar33 * 2 + 0x20028) = 0xcccc;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
          }
          else {
LAB_001282f1:
            memset(piVar17 + 10,0xcc,0x20000);
            memset(piVar17 + 0x800a,0,0x10000);
          }
        }
        else {
          if (iVar14 != 0x29) goto switchD_00128035_caseD_7;
          if ((0x200 < uVar36) || (!bVar50 || !bVar49)) goto LAB_001282f1;
          if (uVar18 != 0) {
            uVar20 = 0;
            do {
              uVar33 = (ulong)((uint)(*(int *)(data + uVar20) * 0x1e35a7bd) >> 0x11);
              piVar17[uVar33 + 10] = -0x33333334;
              *(undefined2 *)((long)piVar17 + uVar33 * 2 + 0x20028) = 0xcccc;
              uVar20 = uVar20 + 1;
            } while (uVar18 != uVar20);
          }
        }
        memset(piVar17 + 0xc00a,0,0x10000);
        *(undefined2 *)(piVar17 + 0x2000a) = 0;
      }
      else {
        if (iVar14 == 0x2a) {
          if ((uVar36 < 0x201) && (bVar50 && bVar49)) {
            if (uVar18 != 0) {
              uVar20 = 0;
              do {
                uVar33 = (ulong)((uint)(*(int *)(data + uVar20) * 0x1e35a7bd) >> 0x11);
                piVar17[uVar33 + 10] = -0x33333334;
                *(undefined2 *)((long)piVar17 + uVar33 * 2 + 0x20028) = 0xcccc;
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
          }
          else {
            memset(piVar17 + 10,0xcc,0x20000);
            memset(piVar17 + 0x800a,0,0x10000);
          }
          memset(piVar17 + 0xc00a,0,0x10000);
          piVar32 = piVar17 + 0x5000a;
          __n = 0x400;
          goto LAB_00128452;
        }
        if (iVar14 == 0x36) {
          piVar32 = piVar17 + 10;
          if ((0x8000 < uVar36) || (!bVar50 || !bVar49)) {
            __n = 0x400010;
            goto LAB_00128452;
          }
          if (uVar18 == 0) goto LAB_00128465;
          uVar20 = 0;
          do {
            *(undefined1 (*) [16])
             (piVar32 + ((ulong)(*(long *)(data + uVar20) * 0x35a7bd1e35a7bd00) >> 0x2c)) =
                 (undefined1  [16])0x0;
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
        }
      }
      goto switchD_00128035_caseD_7;
    }
    if (8 < iVar14 - 2U) goto switchD_00128035_caseD_7;
    switch(iVar14) {
    case 2:
      piVar32 = piVar17 + 10;
      if ((0x800 < uVar36) || (!bVar50 || !bVar49)) {
        __n = 0x40004;
LAB_00128452:
        memset(piVar32,0,__n);
        break;
      }
      if (uVar18 != 0) {
        uVar20 = 0;
        do {
          piVar32[(ulong)(*(long *)(data + uVar20) * -0x42e1ca5843000000) >> 0x30] = 0;
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
        break;
      }
      goto LAB_00128465;
    case 3:
      piVar32 = piVar17 + 10;
      if ((0x800 < uVar36) || (!bVar50 || !bVar49)) {
        __n = 0x40008;
        goto LAB_00128452;
      }
      if (uVar18 == 0) goto LAB_00128465;
      uVar20 = 0;
      do {
        lVar24 = *(long *)(data + uVar20);
        (piVar32 + ((ulong)(lVar24 * -0x42e1ca5843000000) >> 0x30))[0] = 0;
        (piVar32 + ((ulong)(lVar24 * -0x42e1ca5843000000) >> 0x30))[1] = 0;
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
      break;
    case 4:
      piVar32 = piVar17 + 10;
      if ((0x1000 < uVar36) || (!bVar50 || !bVar49)) {
        __n = 0x80010;
        goto LAB_00128452;
      }
      if (uVar18 == 0) goto LAB_00128465;
      uVar20 = 0;
      do {
        *(undefined1 (*) [16])
         (piVar32 + ((ulong)(*(long *)(data + uVar20) * -0x42e1ca5843000000) >> 0x2f)) =
             (undefined1  [16])0x0;
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
      break;
    case 5:
      piVar32 = piVar17 + 0x10;
      if (((bVar50 && bVar49) == 0) || (*(ulong *)(piVar17 + 10) >> 6 < uVar18)) {
        __n = *(ulong *)(piVar17 + 10) * 2;
        goto LAB_00128452;
      }
      if (uVar18 == 0) goto LAB_00128465;
      iVar14 = piVar17[0xe];
      uVar20 = 0;
      do {
        *(undefined2 *)
         ((long)piVar32 +
         (ulong)((uint)(*(int *)(data + uVar20) * 0x1e35a7bd) >> ((byte)iVar14 & 0x1f)) * 2) = 0;
        uVar20 = uVar20 + 1;
      } while (uVar18 != uVar20);
      break;
    case 6:
      PrepareH6((HasherHandle)piVar17,(uint)(bVar50 && bVar49),uVar18,data);
      break;
    case 10:
      iVar14 = piVar17[0x2000c];
      lVar24 = 0;
      do {
        piVar32 = piVar17 + lVar24 + 0xc;
        *piVar32 = iVar14;
        piVar32[1] = iVar14;
        piVar32[2] = iVar14;
        piVar32[3] = iVar14;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 0x20000);
    }
switchD_00128035_caseD_7:
    if (uVar23 == 0) {
LAB_00128465:
      *(undefined1 (*) [16])(piVar17 + 6) = (undefined1  [16])0x0;
    }
    piVar17[5] = 1;
    piVar17 = (int *)s->hasher_;
  }
  iVar14 = *piVar17;
  if (iVar14 < 0x28) {
    switch(iVar14) {
    case 2:
      if ((6 < uVar36) && (2 < uVar23)) {
        piVar17[((ulong)(*(long *)(data + (uVar23 - 3 & uVar2)) * -0x42e1ca5843000000) >> 0x30) + 10
               ] = uVar23 - 3;
        piVar17[((ulong)(*(long *)(data + (uVar23 - 2 & uVar2)) * -0x42e1ca5843000000) >> 0x30) + 10
               ] = uVar23 - 2;
        piVar17[((ulong)(*(long *)(data + (uVar23 - 1 & uVar2)) * -0x42e1ca5843000000) >> 0x30) + 10
               ] = uVar23 - 1;
      }
      break;
    case 3:
      if ((6 < uVar36) && (2 < uVar23)) {
        uVar13 = uVar23 - 3;
        *(uint *)((long)piVar17 +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar13 & uVar2)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar13 >> 3 & 1) != 0)) * 4) + 0x28) = uVar13;
        uVar13 = uVar23 - 2;
        *(uint *)((long)piVar17 +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar13 & uVar2)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar13 >> 3 & 1) != 0)) * 4) + 0x28) = uVar13;
        uVar13 = uVar23 - 1;
        *(uint *)((long)piVar17 +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)(data + (uVar13 & uVar2)) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)((uVar13 >> 3 & 1) != 0)) * 4) + 0x28) = uVar13;
      }
      break;
    case 4:
      if ((uVar36 < 7) || (uVar23 < 3)) break;
      uVar13 = uVar23 - 3;
      piVar17[(ulong)((uint)((ulong)(*(long *)(data + (uVar13 & uVar2)) * -0x42e1ca5843000000) >>
                            0x2f) + (uVar13 >> 3 & 3)) + 10] = uVar13;
      uVar13 = uVar23 - 2;
      piVar17[(ulong)((uint)((ulong)(*(long *)(data + (uVar13 & uVar2)) * -0x42e1ca5843000000) >>
                            0x2f) + (uVar13 >> 3 & 3)) + 10] = uVar13;
      uVar13 = (uint)((ulong)(*(long *)(data + (uVar23 - 1 & uVar2)) * -0x42e1ca5843000000) >> 0x2f)
      ;
      goto LAB_00128794;
    case 5:
      if ((2 < uVar36) && (2 < uVar23)) {
        uVar13 = (uint)(*(int *)(data + (uVar23 - 3 & uVar2)) * 0x1e35a7bd) >>
                 (*(byte *)(piVar17 + 0xe) & 0x1f);
        uVar1 = *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x40);
        lVar24 = *(long *)(piVar17 + 10) * 2 + 0x40;
        *(uint *)((long)piVar17 +
                 (ulong)(uVar13 << (*(byte *)(piVar17 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar17[0xf] & (uint)uVar1) * 4 + lVar24) = uVar23 - 3;
        *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x40) = uVar1 + 1;
        uVar13 = (uint)(*(int *)(data + (uVar23 - 2 & uVar2)) * 0x1e35a7bd) >>
                 (*(byte *)(piVar17 + 0xe) & 0x1f);
        uVar1 = *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x40);
        *(uint *)((long)piVar17 +
                 (ulong)(uVar13 << (*(byte *)(piVar17 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar17[0xf] & (uint)uVar1) * 4 + lVar24) = uVar23 - 2;
        *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x40) = uVar1 + 1;
        uVar13 = (uint)(*(int *)(data + (uVar23 - 1 & uVar2)) * 0x1e35a7bd) >>
                 (*(byte *)(piVar17 + 0xe) & 0x1f);
        uVar1 = *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x40);
        *(uint *)((long)piVar17 +
                 (ulong)(uVar13 << (*(byte *)(piVar17 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar17[0xf] & (uint)uVar1) * 4 + lVar24) = uVar23 - 1;
        *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x40) = uVar1 + 1;
      }
      break;
    case 6:
      if ((6 < uVar36) && (2 < uVar23)) {
        uVar18 = *(ulong *)(piVar17 + 0x10);
        uVar29 = (*(ulong *)(data + (uVar23 - 3 & uVar2)) & uVar18) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)(piVar17 + 0xe) & 0x3f);
        uVar20 = uVar29 & 0xffffffff;
        uVar1 = *(ushort *)((long)piVar17 + uVar20 * 2 + 0x50);
        lVar24 = *(long *)(piVar17 + 10) * 2 + 0x50;
        *(uint *)((long)piVar17 +
                 (ulong)(uint)((int)uVar29 << (*(byte *)(piVar17 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar17[0x12] & (uint)uVar1) * 4 + lVar24) = uVar23 - 3;
        *(ushort *)((long)piVar17 + uVar20 * 2 + 0x50) = uVar1 + 1;
        uVar29 = (*(ulong *)(data + (uVar23 - 2 & uVar2)) & uVar18) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)(piVar17 + 0xe) & 0x3f);
        uVar20 = uVar29 & 0xffffffff;
        uVar1 = *(ushort *)((long)piVar17 + uVar20 * 2 + 0x50);
        *(uint *)((long)piVar17 +
                 (ulong)(uint)((int)uVar29 << (*(byte *)(piVar17 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar17[0x12] & (uint)uVar1) * 4 + lVar24) = uVar23 - 2;
        *(ushort *)((long)piVar17 + uVar20 * 2 + 0x50) = uVar1 + 1;
        uVar18 = (uVar18 & *(ulong *)(data + (uVar23 - 1 & uVar2))) * 0x1fe35a7bd3579bd3 >>
                 (*(byte *)(piVar17 + 0xe) & 0x3f);
        uVar29 = uVar18 & 0xffffffff;
        uVar1 = *(ushort *)((long)piVar17 + uVar29 * 2 + 0x50);
        *(uint *)((long)piVar17 +
                 (ulong)(uint)((int)uVar18 << (*(byte *)(piVar17 + 2) & 0x1f)) * 4 +
                 (ulong)(piVar17[0x12] & (uint)uVar1) * 4 + lVar24) = uVar23 - 1;
        *(ushort *)((long)piVar17 + uVar29 * 2 + 0x50) = uVar1 + 1;
      }
      break;
    case 10:
      if ((2 < uVar36) && (0x7f < uVar23)) {
        uVar20 = uVar29 - 0x7f;
        local_1a0 = (uVar29 + uVar18) - 0x7f;
        if (uVar29 < local_1a0) {
          local_1a0 = uVar29;
        }
        if (uVar20 < local_1a0) {
          local_1d8 = *(ulong *)(piVar17 + 10);
          do {
            uVar18 = uVar29 - uVar20;
            if (uVar18 < 0x10) {
              uVar18 = 0xf;
            }
            uVar42 = (uint)uVar20 & uVar2;
            uVar33 = (ulong)((uint)(*(int *)(data + uVar42) * 0x1e35a7bd) >> 0xf);
            uVar13 = piVar17[uVar33 + 0xc];
            uVar41 = (ulong)uVar13;
            local_210 = (local_1d8 & uVar20) * 2 + 1;
            local_228 = (local_1d8 & uVar20) * 2;
            piVar17[uVar33 + 0xc] = (uint)uVar20;
            if (uVar20 != uVar41) {
              local_1c0 = local_1d8 - uVar18;
              local_1c8 = data + uVar42;
              lVar24 = 0x40;
              local_208 = (size_t *)0x0;
              uVar18 = 0;
LAB_001288c1:
              bVar49 = lVar24 != 0;
              lVar24 = lVar24 + -1;
              if ((uVar20 - uVar41 <= local_1c0) && (bVar49)) {
                uVar42 = (uint)uVar41 & uVar2;
                psVar34 = (size_t *)uVar18;
                if (local_208 < uVar18) {
                  psVar34 = local_208;
                }
                puVar16 = data + (long)psVar34 + (ulong)uVar42;
                uVar33 = 0x80 - (long)psVar34;
                if (7 < uVar33) {
                  uVar28 = uVar33 & 0xfffffffffffffff8;
                  lVar37 = 0;
                  uVar40 = 0;
LAB_00128935:
                  if (*(ulong *)(puVar16 + uVar40 * 8) ==
                      *(ulong *)(local_1c8 + uVar40 * 8 + (long)psVar34)) goto code_r0x00128945;
                  uVar28 = *(ulong *)(local_1c8 + uVar40 * 8 + (long)psVar34) ^
                           *(ulong *)(puVar16 + uVar40 * 8);
                  uVar33 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  uVar40 = (uVar33 >> 3 & 0x1fffffff) - lVar37;
                  goto LAB_0012898d;
                }
                uVar28 = 0;
                goto LAB_00128a1b;
              }
            }
LAB_00128855:
            iVar14 = piVar17[0x2000c];
            piVar17[local_228 + 0x2000e] = iVar14;
LAB_0012886a:
            piVar17[local_210 + 0x2000e] = iVar14;
            uVar20 = uVar20 + 1;
            local_200 = piVar17;
            local_1a8 = uVar29;
            local_198 = mask;
          } while (uVar20 != local_1a0);
        }
      }
    }
  }
  else {
    if (iVar14 < 0x2a) {
      if (((iVar14 == 0x28) || (iVar14 == 0x29)) && ((2 < uVar36 && (2 < uVar23)))) {
        uVar18 = uVar29 - 3;
        uVar13 = (uint)(*(int *)(data + ((uint)uVar18 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar20 = (ulong)uVar13;
        uVar1 = *(ushort *)(piVar17 + 0x2000a);
        uVar33 = uVar18 - (uint)piVar17[uVar20 + 10];
        *(char *)((long)piVar17 + (uVar18 & 0xffff) + 0x30028) = (char)uVar13;
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        *(short *)(piVar17 + (ulong)uVar1 + 0x1000a) = (short)uVar33;
        *(undefined2 *)((long)piVar17 + (ulong)uVar1 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar17 + uVar20 * 2 + 0x20028);
        piVar17[uVar20 + 10] = (uint)uVar18;
        *(ushort *)((long)piVar17 + uVar20 * 2 + 0x20028) = uVar1;
        uVar18 = uVar29 - 2;
        uVar35 = uVar1 + 1;
        uVar13 = (uint)(*(int *)(data + ((uint)uVar18 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar20 = (ulong)uVar13;
        uVar33 = uVar18 - (uint)piVar17[uVar20 + 10];
        *(char *)((long)piVar17 + (uVar18 & 0xffff) + 0x30028) = (char)uVar13;
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        *(short *)(piVar17 + (ulong)uVar35 + 0x1000a) = (short)uVar33;
        *(undefined2 *)((long)piVar17 + (ulong)uVar35 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar17 + uVar20 * 2 + 0x20028);
        piVar17[uVar20 + 10] = (uint)uVar18;
        *(ushort *)((long)piVar17 + uVar20 * 2 + 0x20028) = uVar35;
        uVar29 = uVar29 - 1;
        uVar35 = uVar1 + 2;
        uVar13 = (uint)(*(int *)(data + ((uint)uVar29 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar18 = (ulong)uVar13;
        *(ushort *)(piVar17 + 0x2000a) = uVar1 + 3;
        uVar20 = uVar29 - (uint)piVar17[uVar18 + 10];
        if (0xfffe < uVar20) {
          uVar20 = 0xffff;
        }
        *(char *)((long)piVar17 + (uVar29 & 0xffff) + 0x30028) = (char)uVar13;
        *(short *)(piVar17 + (ulong)uVar35 + 0x1000a) = (short)uVar20;
        *(undefined2 *)((long)piVar17 + (ulong)uVar35 * 4 + 0x4002a) =
             *(undefined2 *)((long)piVar17 + uVar18 * 2 + 0x20028);
        piVar17[uVar18 + 10] = (uint)uVar29;
        *(ushort *)((long)piVar17 + uVar18 * 2 + 0x20028) = uVar35;
      }
      goto switchD_001284a7_caseD_7;
    }
    if (iVar14 == 0x2a) {
      if ((2 < uVar36) && (2 < uVar23)) {
        uVar18 = uVar29 - 3;
        uVar13 = (uint)(*(int *)(data + ((uint)uVar18 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar20 = (ulong)uVar13;
        uVar39 = uVar13 & 0x1ff;
        uVar1 = *(ushort *)((long)piVar17 + (ulong)uVar39 * 2 + 0x140028);
        *(ushort *)((long)piVar17 + (ulong)uVar39 * 2 + 0x140028) = uVar1 + 1;
        uVar42 = uVar1 & 0x1ff;
        uVar33 = uVar18 - (uint)piVar17[uVar20 + 10];
        *(char *)((long)piVar17 + (uVar18 & 0xffff) + 0x30028) = (char)uVar13;
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        *(short *)((long)piVar17 + (ulong)uVar42 * 4 + (ulong)(uVar39 << 0xb) + 0x40028) =
             (short)uVar33;
        *(undefined2 *)((long)piVar17 + (ulong)uVar42 * 4 + (ulong)(uVar39 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar17 + uVar20 * 2 + 0x20028);
        piVar17[uVar20 + 10] = (uint)uVar18;
        *(short *)((long)piVar17 + uVar20 * 2 + 0x20028) = (short)uVar42;
        uVar18 = uVar29 - 2;
        uVar13 = (uint)(*(int *)(data + ((uint)uVar18 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar20 = (ulong)uVar13;
        uVar39 = uVar13 & 0x1ff;
        uVar1 = *(ushort *)((long)piVar17 + (ulong)uVar39 * 2 + 0x140028);
        *(ushort *)((long)piVar17 + (ulong)uVar39 * 2 + 0x140028) = uVar1 + 1;
        uVar42 = uVar1 & 0x1ff;
        uVar33 = uVar18 - (uint)piVar17[uVar20 + 10];
        *(char *)((long)piVar17 + (uVar18 & 0xffff) + 0x30028) = (char)uVar13;
        if (0xfffe < uVar33) {
          uVar33 = 0xffff;
        }
        *(short *)((long)piVar17 + (ulong)uVar42 * 4 + (ulong)(uVar39 << 0xb) + 0x40028) =
             (short)uVar33;
        *(undefined2 *)((long)piVar17 + (ulong)uVar42 * 4 + (ulong)(uVar39 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar17 + uVar20 * 2 + 0x20028);
        piVar17[uVar20 + 10] = (uint)uVar18;
        *(short *)((long)piVar17 + uVar20 * 2 + 0x20028) = (short)uVar42;
        uVar29 = uVar29 - 1;
        uVar42 = (uint)(*(int *)(data + ((uint)uVar29 & uVar2)) * 0x1e35a7bd) >> 0x11;
        uVar18 = (ulong)uVar42;
        uVar13 = uVar42 & 0x1ff;
        uVar1 = *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x140028);
        *(ushort *)((long)piVar17 + (ulong)uVar13 * 2 + 0x140028) = uVar1 + 1;
        uVar39 = uVar1 & 0x1ff;
        uVar20 = uVar29 - (uint)piVar17[uVar18 + 10];
        *(char *)((long)piVar17 + (uVar29 & 0xffff) + 0x30028) = (char)uVar42;
        if (0xfffe < uVar20) {
          uVar20 = 0xffff;
        }
        *(short *)((long)piVar17 + (ulong)uVar39 * 4 + (ulong)(uVar13 << 0xb) + 0x40028) =
             (short)uVar20;
        *(undefined2 *)((long)piVar17 + (ulong)uVar39 * 4 + (ulong)(uVar13 << 0xb) + 0x4002a) =
             *(undefined2 *)((long)piVar17 + uVar18 * 2 + 0x20028);
        piVar17[uVar18 + 10] = (uint)uVar29;
        *(short *)((long)piVar17 + uVar18 * 2 + 0x20028) = (short)uVar39;
      }
      goto switchD_001284a7_caseD_7;
    }
    if (((iVar14 != 0x36) || (uVar36 < 7)) || (uVar23 < 3)) goto switchD_001284a7_caseD_7;
    uVar13 = uVar23 - 3;
    piVar17[(ulong)((uint)((ulong)(*(long *)(data + (uVar13 & uVar2)) * 0x35a7bd1e35a7bd00) >> 0x2c)
                   + (uVar13 >> 3 & 3)) + 10] = uVar13;
    uVar13 = uVar23 - 2;
    piVar17[(ulong)((uint)((ulong)(*(long *)(data + (uVar13 & uVar2)) * 0x35a7bd1e35a7bd00) >> 0x2c)
                   + (uVar13 >> 3 & 3)) + 10] = uVar13;
    uVar13 = (uint)((ulong)(*(long *)(data + (uVar23 - 1 & uVar2)) * 0x35a7bd1e35a7bd00) >> 0x2c);
LAB_00128794:
    piVar17[(ulong)(uVar13 + (uVar23 - 1 >> 3 & 3)) + 10] = uVar23 - 1;
  }
switchD_001284a7_caseD_7:
  uVar18 = s->last_flush_pos_;
  uVar13 = (uint)uVar18;
  if (0xbfffffff < uVar18) {
    uVar13 = ((int)(uVar13 * 2) >> 1 & 0xc0000000U) + (uVar13 & 0x3fffffff) + 0x80000000;
  }
  psVar34 = &s->num_commands_;
  if (((s->params).quality < 10) ||
     (iVar14 = BrotliIsMostlyUTF8(data,(ulong)uVar13,mask,s->input_pos_ - uVar18,0.75), iVar14 != 0)
     ) {
    local_1f8 = 2;
  }
  else {
    local_1f8 = 3;
  }
  sVar46 = *psVar34;
  if ((sVar46 != 0) && (s->last_insert_len_ == 0)) {
    pCVar19 = s->commands_;
    uVar29 = (1L << ((byte)(s->params).lgwin & 0x3f)) - 0x10;
    uVar13 = pCVar19[sVar46 - 1].copy_len_;
    uVar42 = uVar13 & 0x1ffffff;
    uVar18 = s->last_processed_pos_ - (ulong)uVar42;
    if (uVar29 <= uVar18) {
      uVar18 = uVar29;
    }
    iVar14 = s->dist_cache_[0];
    uVar1 = pCVar19[sVar46 - 1].dist_prefix_;
    uVar45 = uVar1 & 0x3ff;
    uVar31 = (s->params).dist.num_direct_distance_codes;
    uVar39 = uVar31 + 0x10;
    local_210 = CONCAT44(local_210._4_4_,(uint)uVar1);
    if (uVar39 <= uVar45) {
      uVar3 = (s->params).dist.distance_postfix_bits;
      bVar21 = (byte)uVar3;
      uVar45 = (uVar45 - uVar31) - 0x10;
      uVar45 = (~(-1 << (bVar21 & 0x1f)) & uVar45) + uVar39 +
               (pCVar19[sVar46 - 1].dist_extra_ +
                (((uVar45 >> (uVar3 & 0x1f) & 1) != 0) + 2 << ((byte)(uVar1 >> 10) & 0x1f)) + -4 <<
               (bVar21 & 0x1f));
    }
    if ((ulong)(uVar45 - 0xf) == (long)iVar14 || uVar45 < 0x10) {
      if ((ulong)(long)iVar14 <= uVar18) {
        if (uVar36 == 0) {
          local_240 = 0;
        }
        else {
          uVar36 = (s->ringbuffer_).mask_;
          puVar16 = (s->ringbuffer_).buffer_;
          iVar26 = (int)uVar27 + uVar23;
          do {
            if (puVar16[uVar23 & uVar36] != puVar16[uVar23 - iVar14 & uVar36]) goto LAB_001290a4;
            uVar13 = uVar13 + 1;
            pCVar19[sVar46 - 1].copy_len_ = uVar13;
            uVar23 = uVar23 + 1;
            uVar42 = (int)local_240 - 1;
            local_240 = (ulong)uVar42;
          } while (uVar42 != 0);
          local_240 = 0;
          uVar23 = iVar26 - (int)local_1f0;
LAB_001290a4:
          uVar42 = uVar13 & 0x1ffffff;
        }
      }
      local_250 = (ulong)uVar23;
      uVar23 = pCVar19[sVar46 - 1].insert_len_;
      uVar42 = (uVar13 >> 0x19) + uVar42;
      uVar13 = uVar23;
      if (5 < (ulong)uVar23) {
        if (uVar23 < 0x82) {
          uVar27 = (ulong)uVar23 - 2;
          uVar23 = 0x1f;
          uVar13 = (uint)uVar27;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar23 == 0; uVar23 = uVar23 - 1) {
            }
          }
          uVar13 = (int)(uVar27 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar23 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar23 < 0x842) {
          uVar13 = 0x1f;
          if (uVar23 - 0x42 != 0) {
            for (; uVar23 - 0x42 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffe0) + 0x2a;
        }
        else {
          uVar13 = 0x15;
          if (0x1841 < uVar23) {
            uVar13 = (uint)(ushort)(0x17 - (uVar23 < 0x5842));
          }
        }
      }
      if (uVar42 < 10) {
        uVar23 = uVar42 - 2;
      }
      else if (uVar42 < 0x86) {
        uVar23 = 0x1f;
        uVar36 = (uint)((ulong)uVar42 - 6);
        if (uVar36 != 0) {
          for (; uVar36 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar23 = (int)((ulong)uVar42 - 6 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar23 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar23 = 0x17;
        if (uVar42 < 0x846) {
          uVar23 = 0x1f;
          if (uVar42 - 0x46 != 0) {
            for (; uVar42 - 0x46 >> uVar23 == 0; uVar23 = uVar23 - 1) {
            }
          }
          uVar23 = (uVar23 ^ 0xffe0) + 0x2c;
        }
      }
      uVar35 = (ushort)uVar23;
      uVar25 = (uVar35 & 7) + ((ushort)uVar13 & 7) * 8;
      if ((((uVar1 & 0x3ff) == 0) && ((ushort)uVar13 < 8)) && (uVar35 < 0x10)) {
        if (7 < uVar35) {
          uVar25 = uVar25 + 0x40;
        }
      }
      else {
        iVar14 = ((uVar13 & 0xffff) >> 3) * 3 + ((uVar23 & 0xffff) >> 3);
        uVar25 = uVar25 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar14 * 0x40 + 0x40;
      }
      pCVar19[sVar46 - 1].cmd_prefix_ = uVar25;
    }
  }
  iVar14 = (s->params).quality;
  local_240 = local_240 & 0xffffffff;
  puVar4 = s->hasher_;
  local_1f0 = s->dist_cache_;
  last_insert_len = &s->last_insert_len_;
  pCVar19 = s->commands_ + sVar46;
  num_literals = &s->num_literals_;
  local_208 = psVar34;
  if (iVar14 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,local_240,local_250,data,mask,&s->params,puVar4,local_1f0,last_insert_len,pCVar19,
               psVar34,num_literals);
  }
  else if (iVar14 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,local_240,local_250,data,mask,&s->params,puVar4,local_1f0,last_insert_len,pCVar19,
               psVar34,num_literals);
  }
  else {
    BrotliCreateBackwardReferences
              (local_240,local_250,data,mask,&s->params,puVar4,local_1f0,last_insert_len,pCVar19,
               psVar34,num_literals);
  }
  iVar14 = (s->params).lgwin;
  iVar26 = (s->params).lgblock;
  if (iVar26 < iVar14) {
    iVar26 = iVar14;
  }
  cVar22 = '\x17';
  if (iVar26 < 0x17) {
    cVar22 = (char)iVar26;
  }
  uVar27 = 1L << (cVar22 + 1U & 0x3f);
  uVar5 = s->input_pos_;
  uVar6 = s->last_flush_pos_;
  EnsureInitialized(s);
  if ((s->params).quality < 4) {
    bVar49 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar49 = false;
  }
  uVar23 = (uint)local_1e8 | is_last;
  local_1e8 = CONCAT44(local_1e8._4_4_,uVar23);
  if (((uVar23 != 0) || (bVar49)) ||
     ((uVar27 < (uVar5 - uVar6) + (1L << ((byte)(s->params).lgblock & 0x3f)) ||
      ((uVar27 = uVar27 >> 3, uVar27 <= s->num_literals_ || (uVar27 <= *local_208)))))) {
    uVar27 = s->last_insert_len_;
    if (uVar27 != 0) {
      pCVar19 = s->commands_;
      sVar46 = s->num_commands_;
      s->num_commands_ = sVar46 + 1;
      pCVar19[sVar46].insert_len_ = (uint32_t)uVar27;
      pCVar19[sVar46].copy_len_ = 0x8000000;
      pCVar19[sVar46].dist_extra_ = 0;
      pCVar19[sVar46].dist_prefix_ = 0x10;
      if (uVar27 < 6) {
        uVar18 = uVar27 & 0xffffffff;
      }
      else if (uVar27 < 0x82) {
        uVar23 = 0x1f;
        uVar13 = (uint)(uVar27 - 2);
        if (uVar13 != 0) {
          for (; uVar13 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar18 = (ulong)((int)(uVar27 - 2 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar23 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar27 < 0x842) {
        uVar13 = (uint32_t)uVar27 - 0x42;
        uVar23 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar18 = (ulong)((uVar23 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar18 = 0x15;
        if (0x1841 < uVar27) {
          uVar18 = (ulong)(ushort)(0x17 - (uVar27 < 0x5842));
        }
      }
      iVar14 = (int)((uVar18 & 0xffff) >> 3) * 3;
      pCVar19[sVar46].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar14 * 0x40 +
           ((ushort)uVar18 & 7) * 8 + 0x42;
      s->num_literals_ = s->num_literals_ + uVar27;
      s->last_insert_len_ = 0;
    }
    uVar27 = s->input_pos_ - s->last_flush_pos_;
    if (uVar27 != 0 || is_last != 0) {
      puVar16 = GetBrotliStorage(s,(ulong)((int)uVar27 * 2 + 0x1f7));
      bVar21 = s->last_bytes_bits_;
      storage_ix_1 = (size_t)bVar21;
      *puVar16 = (uint8_t)s->last_bytes_;
      puVar16[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
      uVar18 = s->last_flush_pos_;
      uVar27 = uVar27 & 0xffffffff;
      uVar23 = (uint)uVar18;
      if (0xbfffffff < uVar18) {
        uVar23 = (uVar23 & 0x3fffffff) + ((int)(uVar23 * 2) >> 1 & 0xc0000000U) + 0x80000000;
      }
      prev_byte = s->prev_byte_;
      prev_byte2 = s->prev_byte2_;
      sVar46 = s->num_literals_;
      pCVar19 = s->commands_;
      num_commands = s->num_commands_;
      piVar17 = s->saved_dist_cache_;
      pBVar30 = s;
      psVar34 = &table_size;
      for (lVar24 = 0x10; lVar24 != 0; lVar24 = lVar24 + -1) {
        *psVar34 = *(size_t *)&pBVar30->params;
        pBVar30 = (BrotliEncoderState *)((long)pBVar30 + (ulong)bVar51 * -0x10 + 8);
        psVar34 = psVar34 + (ulong)bVar51 * -2 + 1;
      }
      if (uVar27 == 0) {
        *(ulong *)(puVar16 + (bVar21 >> 3)) = 3L << (bVar21 & 7) | (ulong)puVar16[bVar21 >> 3];
        storage_ix_1 = (size_t)(bVar21 + 9 & 0xfffffff8);
        ppuVar43 = local_1e0;
      }
      else {
        local_210 = storage_ix_1;
        local_1e8 = num_commands;
        iVar14 = ShouldCompress(data,mask,uVar18,uVar27,sVar46,num_commands);
        sVar46 = local_1e8;
        if (iVar14 == 0) {
          uVar7 = *(undefined8 *)(s->saved_dist_cache_ + 2);
          *(undefined8 *)local_1f0 = *(undefined8 *)piVar17;
          *(undefined8 *)(local_1f0 + 2) = uVar7;
          BrotliStoreUncompressedMetaBlock
                    (is_last,data,(ulong)uVar23,mask,uVar27,&storage_ix_1,puVar16);
          ppuVar43 = local_1e0;
        }
        else {
          local_1c8 = (uint8_t *)CONCAT71(local_1c8._1_7_,*puVar16);
          local_1c0 = CONCAT71(local_1c0._1_7_,puVar16[1]);
          iVar14 = (s->params).quality;
          if (iVar14 < 3) {
            BrotliStoreMetaBlockFast
                      (m,data,(ulong)uVar23,uVar27,mask,is_last,&s->params,pCVar19,local_1e8,
                       &storage_ix_1,puVar16);
          }
          else if (iVar14 == 3) {
            BrotliStoreMetaBlockTrivial
                      (m,data,(ulong)uVar23,uVar27,mask,is_last,&s->params,pCVar19,local_1e8,
                       &storage_ix_1,puVar16);
          }
          else {
            BrotliInitBlockSplit((BlockSplit *)&storage_ix);
            BrotliInitBlockSplit(&local_160);
            BrotliInitBlockSplit(&local_130);
            local_c0 = (undefined1  [16])0x0;
            local_d0 = (undefined1  [16])0x0;
            local_e0 = (undefined1  [16])0x0;
            local_f0 = (undefined1  [16])0x0;
            local_100 = (undefined1  [16])0x0;
            iVar14 = (s->params).quality;
            local_200 = (int *)(ulong)uVar23;
            local_1d8 = (ulong)prev_byte2;
            literal_context_mode = (ContextType)local_1f8;
            if (iVar14 < 10) {
              num_literal_contexts = 1;
              local_1b8 = (uint32_t *)0x0;
              if ((s->params).disable_literal_context_modeling == 0) {
                DecideOverLiteralContextModeling
                          (data,(size_t)local_200,uVar27,mask,iVar14,(s->params).size_hint,
                           &num_literal_contexts,&local_1b8);
              }
              sVar46 = local_1e8;
              BrotliBuildMetaBlockGreedy
                        (m,data,(size_t)local_200,mask,prev_byte,prev_byte2,
                         "" + (literal_context_mode << 9),num_literal_contexts,local_1b8,pCVar19,
                         local_1e8,(MetaBlockSplit *)&storage_ix);
            }
            else {
              BrotliBuildMetaBlock
                        (m,data,(size_t)local_200,mask,(BrotliEncoderParams *)&table_size,prev_byte,
                         prev_byte2,pCVar19,sVar46,literal_context_mode,
                         (MetaBlockSplit *)&storage_ix);
            }
            if (3 < (s->params).quality) {
              uVar31 = 0x220;
              if (local_70 < 0x220) {
                uVar31 = local_70;
              }
              BrotliOptimizeHistograms(uVar31,(MetaBlockSplit *)&storage_ix);
            }
            BrotliStoreMetaBlock
                      (m,data,(size_t)local_200,uVar27,mask,prev_byte,(uint8_t)local_1d8,is_last,
                       (BrotliEncoderParams *)&table_size,(ContextType)local_1f8,pCVar19,sVar46,
                       (MetaBlockSplit *)&storage_ix,&storage_ix_1,puVar16);
            BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
            BrotliDestroyBlockSplit(m,&local_160);
            BrotliDestroyBlockSplit(m,&local_130);
            BrotliFree(m,(void *)local_100._0_8_);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_100._8_8_;
            local_100 = auVar8 << 0x40;
            BrotliFree(m,(void *)local_f0._0_8_);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_f0._8_8_;
            local_f0 = auVar9 << 0x40;
            BrotliFree(m,(void *)local_e0._0_8_);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_e0._8_8_;
            local_e0 = auVar10 << 0x40;
            BrotliFree(m,(void *)local_d0._0_8_);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_d0._8_8_;
            local_d0 = auVar11 << 0x40;
            BrotliFree(m,(void *)local_c0._0_8_);
          }
          ppuVar43 = local_1e0;
          if (uVar27 + 4 < storage_ix_1 >> 3) {
            uVar7 = *(undefined8 *)(s->saved_dist_cache_ + 2);
            *(undefined8 *)local_1f0 = *(undefined8 *)piVar17;
            *(undefined8 *)(local_1f0 + 2) = uVar7;
            *puVar16 = (uint8_t)local_1c8;
            puVar16[1] = (uint8_t)local_1c0;
            storage_ix_1 = local_210;
            BrotliStoreUncompressedMetaBlock
                      (is_last,data,(ulong)uVar23,mask,uVar27,&storage_ix_1,puVar16);
          }
        }
      }
      uVar27 = storage_ix_1 >> 3;
      s->last_bytes_ = (ushort)puVar16[uVar27];
      s->last_bytes_bits_ = (byte)storage_ix_1 & 7;
      s->last_flush_pos_ = s->input_pos_;
      iVar14 = UpdateLastProcessedPos(s);
      if ((iVar14 != 0) && (puVar4 = s->hasher_, puVar4 != (HasherHandle)0x0)) {
        puVar4[0x14] = '\0';
        puVar4[0x15] = '\0';
        puVar4[0x16] = '\0';
        puVar4[0x17] = '\0';
      }
      uVar5 = s->last_flush_pos_;
      if (uVar5 != 0) {
        s->prev_byte_ = data[uVar2 & (int)uVar5 - 1U];
        if (uVar5 != 1) {
          s->prev_byte2_ = data[uVar2 & (int)uVar5 - 2U];
        }
      }
      local_208[0] = 0;
      local_208[1] = 0;
      uVar7 = *(undefined8 *)(local_1f0 + 2);
      *(undefined8 *)piVar17 = *(undefined8 *)local_1f0;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar7;
      *ppuVar43 = puVar16;
      *local_1d0 = uVar27;
      return 1;
    }
  }
  else {
    iVar14 = UpdateLastProcessedPos(s);
    if ((iVar14 != 0) && (puVar4 = s->hasher_, puVar4 != (HasherHandle)0x0)) {
      puVar4[0x14] = '\0';
      puVar4[0x15] = '\0';
      puVar4[0x16] = '\0';
      puVar4[0x17] = '\0';
    }
  }
  *local_1d0 = 0;
  return 1;
code_r0x00128945:
  uVar40 = uVar40 + 1;
  lVar37 = lVar37 + -8;
  if (uVar33 >> 3 == uVar40) goto code_r0x00128954;
  goto LAB_00128935;
code_r0x00128954:
  puVar16 = puVar16 + -lVar37;
LAB_00128a1b:
  uVar33 = uVar33 & 7;
  uVar40 = uVar28;
  if (uVar33 != 0) {
    uVar38 = uVar28 | uVar33;
    do {
      uVar40 = uVar28;
      if (local_1c8[uVar28 + (long)psVar34] != *puVar16) break;
      puVar16 = puVar16 + 1;
      uVar28 = uVar28 + 1;
      uVar33 = uVar33 - 1;
      uVar40 = uVar38;
    } while (uVar33 != 0);
  }
LAB_0012898d:
  uVar40 = uVar40 + (long)psVar34;
  local_1f8 = uVar18;
  if (0x7f < uVar40) {
    piVar17[local_228 + 0x2000e] = piVar17[(uVar41 & local_1d8) * 2 + 0x2000e];
    iVar14 = piVar17[(uVar41 & local_1d8) * 2 + 0x2000f];
    goto LAB_0012886a;
  }
  uVar33 = (uVar41 & local_1d8) * 2;
  if (data[uVar40 + uVar42] < local_1c8[uVar40]) {
    piVar17[local_228 + 0x2000e] = uVar13;
    uVar33 = uVar33 | 1;
    local_228 = uVar33;
    local_208 = (size_t *)uVar40;
  }
  else {
    piVar17[local_210 + 0x2000e] = uVar13;
    uVar18 = uVar40;
    local_210 = uVar33;
  }
  uVar13 = piVar17[uVar33 + 0x2000e];
  uVar41 = (ulong)uVar13;
  if (uVar20 == uVar41) goto LAB_00128855;
  goto LAB_001288c1;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m,
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos,
        data, mask, &s->params, s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}